

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::FatalValidationError::FatalValidationError(FatalValidationError *this,ValidationReport *report)

{
  long in_RSI;
  ValidationReport *in_RDI;
  ValidationReport *in_stack_ffffffffffffffd8;
  
  std::runtime_error::runtime_error((runtime_error *)in_RDI,(string *)(in_RSI + 0x28));
  *(undefined ***)in_RDI = &PTR__FatalValidationError_004319f0;
  ValidationReport::ValidationReport(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit FatalValidationError(ValidationReport report) :
        std::runtime_error(report.details),
        report(std::move(report)) {}